

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
          (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *this,
          SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *list)

{
  SListNodeBase<Memory::ArenaAllocator> *this_00;
  Type_conflict pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type_conflict *ppSVar5;
  NodeBase *node;
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *list_local;
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  bVar3 = Empty(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x1ba,"(!this->Empty())","!this->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this->super_SListNodeBase<Memory::ArenaAllocator>);
  this_00 = *ppSVar5;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next(this_00);
  pSVar1 = *ppSVar5;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this->super_SListNodeBase<Memory::ArenaAllocator>);
  *ppSVar5 = pSVar1;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&list->super_SListNodeBase<Memory::ArenaAllocator>);
  pSVar1 = *ppSVar5;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next(this_00);
  *ppSVar5 = pSVar1;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&list->super_SListNodeBase<Memory::ArenaAllocator>);
  *ppSVar5 = this_00;
  RealCount::IncrementCount(&list->super_RealCount);
  RealCount::DecrementCount(&this->super_RealCount);
  return;
}

Assistant:

void MoveHeadTo(SListBase * list)
    {
        Assert(!this->Empty());
        NodeBase * node = this->Next();
        this->Next() = node->Next();
        node->Next() = list->Next();
        list->Next() = node;

        list->IncrementCount();
        this->DecrementCount();
    }